

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O0

void Cnf_ManPostprocess(Cnf_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Cnf_Cut_t *pCut_00;
  Cnf_Cut_t *pCVar2;
  Cnf_Cut_t *pCut_01;
  bool bVar3;
  int local_d8;
  int Temp;
  int fChanges;
  int k;
  int i;
  int Costs [16];
  int Order [16];
  Aig_Obj_t *pFan;
  Aig_Obj_t *pObj;
  Cnf_Cut_t *pCutRes;
  Cnf_Cut_t *pCutFan;
  Cnf_Cut_t *pCut;
  Cnf_Man_t *p_local;
  
  fChanges = 0;
LAB_006a88d9:
  iVar1 = Vec_PtrSize(p->pManAig->vObjs);
  if (iVar1 <= fChanges) {
    return;
  }
  pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,fChanges);
  if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
     ((*(ulong *)&pObj_00->field_0x18 >> 6 & 0x3ffffff) != 0)) {
    pCut_00 = Cnf_ObjBestCut(pObj_00);
    Temp = 0;
    while( true ) {
      bVar3 = false;
      if (Temp < pCut_00->nFanins) {
        Order._56_8_ = Aig_ManObj(p->pManAig,*(int *)((long)pCut_00[1].vIsop + (long)Temp * 4 + -8))
        ;
        bVar3 = (Aig_Obj_t *)Order._56_8_ != (Aig_Obj_t *)0x0;
      }
      if (!bVar3) break;
      Costs[(long)Temp + 0xe] = Temp;
      iVar1 = Aig_ObjIsNode((Aig_Obj_t *)Order._56_8_);
      if (iVar1 == 0) {
        local_d8 = 0;
      }
      else {
        pCVar2 = Cnf_ObjBestCut((Aig_Obj_t *)Order._56_8_);
        local_d8 = (int)pCVar2->Cost;
      }
      (&k)[Temp] = local_d8;
      Temp = Temp + 1;
    }
    do {
      bVar3 = false;
      for (Temp = 0; Temp < pCut_00->nFanins + -1; Temp = Temp + 1) {
        if ((&k)[Costs[(long)(Temp + 1) + 0xe]] < (&k)[Costs[(long)Temp + 0xe]]) {
          iVar1 = Costs[(long)Temp + 0xe];
          Costs[(long)Temp + 0xe] = Costs[(long)(Temp + 1) + 0xe];
          Costs[(long)(Temp + 1) + 0xe] = iVar1;
          bVar3 = true;
        }
      }
    } while (bVar3);
    Temp = 0;
    do {
      bVar3 = false;
      if (Temp < pCut_00->nFanins) {
        Order._56_8_ = Aig_ManObj(p->pManAig,
                                  *(int *)((long)pCut_00[1].vIsop +
                                          (long)Costs[(long)Temp + 0xe] * 4 + -8));
        bVar3 = (Aig_Obj_t *)Order._56_8_ != (Aig_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Aig_ObjIsNode((Aig_Obj_t *)Order._56_8_);
      if (iVar1 != 0) {
        if ((*(ulong *)(Order._56_8_ + 0x18) >> 6 & 0x3ffffff) == 0) {
          __assert_fail("pFan->nRefs != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                        ,0xcc,"void Cnf_ManPostprocess(Cnf_Man_t *)");
        }
        if (((uint)(*(ulong *)(Order._56_8_ + 0x18) >> 6) & 0x3ffffff) == 1) {
          pCVar2 = Cnf_ObjBestCut((Aig_Obj_t *)Order._56_8_);
          pCut_01 = Cnf_CutCompose(p,pCut_00,pCVar2,*(int *)(Order._56_8_ + 0x24));
          if (((pCut_01 != (Cnf_Cut_t *)0x0) && (pCut_01->Cost != '\x7f')) &&
             ((int)pCut_01->Cost <= (int)pCut_00->Cost + (int)pCVar2->Cost)) goto LAB_006a8c3f;
          if (pCut_01 != (Cnf_Cut_t *)0x0) {
            Cnf_CutFree(pCut_01);
          }
        }
      }
      Temp = Temp + 1;
    } while( true );
  }
  goto LAB_006a8cd2;
LAB_006a8c3f:
  Cnf_ObjSetBestCut(pObj_00,pCut_01);
  Cnf_ObjSetBestCut((Aig_Obj_t *)Order._56_8_,(Cnf_Cut_t *)0x0);
  Cnf_CutUpdateRefs(p,pCut_00,pCVar2,pCut_01);
  if ((*(ulong *)(Order._56_8_ + 0x18) >> 6 & 0x3ffffff) != 0) {
    __assert_fail("pFan->nRefs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                  ,0xe0,"void Cnf_ManPostprocess(Cnf_Man_t *)");
  }
  Cnf_CutFree(pCut_00);
  Cnf_CutFree(pCVar2);
LAB_006a8cd2:
  fChanges = fChanges + 1;
  goto LAB_006a88d9;
}

Assistant:

void Cnf_ManPostprocess( Cnf_Man_t * p )
{
    Cnf_Cut_t * pCut, * pCutFan, * pCutRes;
    Aig_Obj_t * pObj, * pFan;
    int Order[16], Costs[16];
    int i, k, fChanges;
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
        if ( pObj->nRefs == 0 )
            continue;
        pCut = Cnf_ObjBestCut(pObj);

        // sort fanins according to their size
        Cnf_CutForEachLeaf( p->pManAig, pCut, pFan, k )
        {
            Order[k] = k;
            Costs[k] = Aig_ObjIsNode(pFan)? Cnf_ObjBestCut(pFan)->Cost : 0;
        }
        // sort the cuts by Weight
        do {
            int Temp;
            fChanges = 0;
            for ( k = 0; k < pCut->nFanins - 1; k++ )
            {
                if ( Costs[Order[k]] <= Costs[Order[k+1]] )
                    continue;
                Temp = Order[k];
                Order[k] = Order[k+1];
                Order[k+1] = Temp;
                fChanges = 1;
            }
        } while ( fChanges );


//        Cnf_CutForEachLeaf( p->pManAig, pCut, pFan, k )
        for ( k = 0; (k < (int)(pCut)->nFanins) && ((pFan) = Aig_ManObj(p->pManAig, (pCut)->pFanins[Order[k]])); k++ )
        {
            if ( !Aig_ObjIsNode(pFan) )
                continue;
            assert( pFan->nRefs != 0 );
            if ( pFan->nRefs != 1 )
                continue;
            pCutFan = Cnf_ObjBestCut(pFan);
            // try composing these two cuts
//            Cnf_CutPrint( pCut );
            pCutRes = Cnf_CutCompose( p, pCut, pCutFan, pFan->Id );
//            Cnf_CutPrint( pCut );
//            printf( "\n" );
            // check if the cost if reduced
            if ( pCutRes == NULL || pCutRes->Cost == 127 || pCutRes->Cost > pCut->Cost + pCutFan->Cost )
            {
                if ( pCutRes )
                    Cnf_CutFree( pCutRes );
                continue;
            }
            // update the cut
            Cnf_ObjSetBestCut( pObj, pCutRes );
            Cnf_ObjSetBestCut( pFan, NULL );
            Cnf_CutUpdateRefs( p, pCut, pCutFan, pCutRes );
            assert( pFan->nRefs == 0 );
            Cnf_CutFree( pCut );
            Cnf_CutFree( pCutFan );
            break;
        }
    }
}